

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O1

void __thiscall HVectorBase<double>::clearScalars(HVectorBase<double> *this)

{
  this->packFlag = false;
  this->count = 0;
  this->synthetic_tick = 0.0;
  this->next = (HVectorBase<double> *)0x0;
  return;
}

Assistant:

void HVectorBase<Real>::clearScalars() {
  /*
   * Clear scalars in an HVector instance
   */
  // Reset the flag to indicate when to pack
  this->packFlag = false;
  // Zero the number of stored indices
  this->count = 0;
  // Zero the synthetic clock for operations with this vector
  this->synthetic_tick = 0;
  // Initialise the next value
  this->next = 0;
}